

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::on_finish
          (tag_scalar_t<int,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info)

{
  undefined8 *puVar1;
  tag_t<cfgfile::string_trait_t> *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  exception_t<cfgfile::string_trait_t> *peVar4;
  undefined8 *puVar5;
  allocator local_2b5;
  allocator local_2b4;
  allocator local_2b3;
  allocator local_2b2;
  allocator local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_tag_t<cfgfile::string_trait_t>).m_is_defined == false) {
    peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1d0,"Undefined value of tag: \"",(allocator *)local_90);
    std::__cxx11::string::string((string *)&local_1b0,(string *)&local_1d0);
    std::operator+(&local_190,&local_1b0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    std::__cxx11::string::string(local_210,"\". In file \"",(allocator *)&local_b0);
    std::__cxx11::string::string((string *)&local_1f0,local_210);
    std::operator+(&local_170,&local_190,&local_1f0);
    std::operator+(&local_150,&local_170,&info->m_file_name);
    std::__cxx11::string::string(local_250,"\" on line ",(allocator *)&local_d0);
    std::__cxx11::string::string((string *)&local_230,local_250);
    std::operator+(&local_130,&local_150,&local_230);
    std::__cxx11::to_string(&local_270,info->m_line_number);
    std::operator+(&local_110,&local_130,&local_270);
    std::__cxx11::string::string((string *)&local_2b0,".",(allocator *)local_f0);
    std::__cxx11::string::string((string *)&local_290,(string *)&local_2b0);
    std::operator+(&local_50,&local_110,&local_290);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_50);
    __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
  puVar5 = *(undefined8 **)CONCAT44(extraout_var,iVar3);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  do {
    if (puVar5 == puVar1) {
      return;
    }
    this_00 = (tag_t<cfgfile::string_trait_t> *)*puVar5;
    if (this_00->m_is_mandatory == true) {
      bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(this_00);
      if (!bVar2) {
        peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_210,"Undefined child mandatory tag: \"",&local_2b1);
        std::__cxx11::string::string((string *)&local_1f0,local_210);
        std::operator+(&local_1d0,&local_1f0,&this_00->m_name);
        std::__cxx11::string::string(local_250,"\". Where parent is: \"",&local_2b2);
        std::__cxx11::string::string((string *)&local_230,local_250);
        std::operator+(&local_1b0,&local_1d0,&local_230);
        std::operator+(&local_190,&local_1b0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
        std::__cxx11::string::string((string *)&local_290,"\". In file \"",&local_2b3);
        std::__cxx11::string::string((string *)&local_270,(string *)&local_290);
        std::operator+(&local_170,&local_190,&local_270);
        std::operator+(&local_150,&local_170,&info->m_file_name);
        std::__cxx11::string::string(local_90,"\" on line ",&local_2b4);
        std::__cxx11::string::string((string *)&local_2b0,local_90);
        std::operator+(&local_130,&local_150,&local_2b0);
        std::__cxx11::to_string(&local_b0,info->m_line_number);
        std::operator+(&local_110,&local_130,&local_b0);
        std::__cxx11::string::string(local_f0,".",&local_2b5);
        std::__cxx11::string::string((string *)&local_d0,local_f0);
        std::operator+(&local_70,&local_110,&local_d0);
        exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_70);
        __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}